

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::OrthoCamera::setPart(OrthoCamera *this,long x,long y,long w,long h)

{
  Vector3d *a;
  Vector3d T;
  SVector<double,_3> local_48;
  
  (this->super_Camera).width = w;
  (this->super_Camera).height = h;
  a = &(this->super_Camera).T;
  SVector<double,_3>::SVector(&local_48,a);
  local_48.v[0] = this->res * (double)x + local_48.v[0];
  local_48.v[1] = this->res * -(double)y + local_48.v[1];
  SVector<double,_3>::operator=(a,&local_48);
  return;
}

Assistant:

void OrthoCamera::setPart(long x, long y, long w, long h)
{
  Camera::setPart(x, y, w, h);

  Vector3d T=getT();

  T[0]+=x*res;
  T[1]-=y*res;

  setT(T);
}